

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O2

bool __thiscall
DSK::PutFileInDsk(DSK *this,string *Masque,int TypeModeImport,int loadAddress,int exeAddress,
                 int UserNumber,bool System_file,bool Read_only)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t __n;
  char *pcVar3;
  StAmsdos *this_00;
  
  PutFileInDsk::cFileName = GetNomAmsdos((Masque->_M_dataplus)._M_p);
  __stream = fopen((Masque->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  __n = fread(PutFileInDsk::Buff,1,0x20000,__stream);
  fclose(__stream);
  if (TypeModeImport == 2) {
    bVar1 = false;
  }
  else {
    bVar1 = CheckAmsdos(PutFileInDsk::Buff);
  }
  iVar2 = 1;
  if (exeAddress == 0 && loadAddress == 0) {
    iVar2 = TypeModeImport;
  }
  if (iVar2 == 2) {
    pcVar3 = "Using raw mode, no header\n";
  }
  else {
    if (iVar2 != 1) {
      if ((iVar2 == 0) && (bVar1 != false)) {
        __n = __n - 0x80;
        memmove(PutFileInDsk::Buff,PutFileInDsk::Buff + 0x80,__n);
      }
      goto LAB_00113259;
    }
    if (bVar1 == false) {
      if (0xffff < __n) {
        std::operator<<((ostream *)&std::cerr,
                        "Creating an header for files larger than 64K is not supported yet\n");
        return false;
      }
      std::operator<<((ostream *)&std::cout,"Automatically generating header for file\n");
      CreeEnteteAmsdos(PutFileInDsk::cFileName,(unsigned_short)__n);
      if (loadAddress != 0) {
        CreeEnteteAmsdos::Entete.Adress = (unsigned_short)loadAddress;
      }
      if (exeAddress != 0) {
        CreeEnteteAmsdos::Entete.EntryAdress = (unsigned_short)exeAddress;
      }
      this_00 = &CreeEnteteAmsdos::Entete;
      SetChecksum(&CreeEnteteAmsdos::Entete);
      bVar1 = isBigEndian();
      if (bVar1) {
        StAmsdosEndian((DSK *)this_00,&CreeEnteteAmsdos::Entete);
      }
      memmove(PutFileInDsk::Buff + 0x80,PutFileInDsk::Buff,__n);
      memcpy(PutFileInDsk::Buff,&CreeEnteteAmsdos::Entete,0x80);
      __n = __n + 0x80;
      goto LAB_00113259;
    }
    pcVar3 = "File already has an header\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar3);
LAB_00113259:
  iVar2 = CopieFichier(this,PutFileInDsk::Buff,PutFileInDsk::cFileName,(int)__n,0x100,UserNumber,
                       System_file,Read_only);
  return iVar2 == 0;
}

Assistant:

bool DSK::PutFileInDsk(string Masque, int TypeModeImport,
	int loadAddress, int exeAddress, int UserNumber,
	bool System_file, bool Read_only )
{
	static unsigned char Buff[0x20000];
	static char *cFileName;
	unsigned long Lg;
	bool ret;
	FILE* Hfile;

	// Get AMSDOS-formatted name
	cFileName = GetNomAmsdos(Masque.c_str());

	// Open and read the input file
	if ((Hfile = fopen(Masque.c_str(),"rb")) == NULL)
		return false;
	Lg=fread(Buff,1, 0x20000 ,Hfile);
	fclose( Hfile );

	// Check if file already has an header
	bool IsAmsdos = (TypeModeImport != MODE_RAW) &&  CheckAmsdos(Buff);

	// Force binary mode if a load or execution address is specified
	if (loadAddress != 0 || exeAddress != 0)
		TypeModeImport = MODE_BINAIRE;

	switch(TypeModeImport) {
		case MODE_ASCII:
			// In ASCII mode, delete the header if there is one
			if (IsAmsdos) {
				memmove(Buff, Buff + sizeof(StAmsdos), Lg - sizeof(StAmsdos));
				Lg -= sizeof(StAmsdos);
			}
		break;

		case MODE_BINAIRE :
			// In binary mode, add an header if there is none
			if ( ! IsAmsdos ) {
				// Sanity check on file size (we cast to unsigned short)
				if ( Lg >= 0x10000 ) {
					cerr << "Creating an header for files larger than 64K is not supported yet\n";
					return false;
				}
		
				// Create and fill AMSDOS header
				cout << "Automatically generating header for file\n";
				StAmsdos * e;
				e = CreeEnteteAmsdos(cFileName, (unsigned short)Lg);
				if (loadAddress != 0)
				{
					e->Adress = (unsigned short)loadAddress;
				}
				if (exeAddress != 0)
				{
					e->EntryAdress = (unsigned short)exeAddress;
				}
				// After changing addresses, recompute header checksum
				SetChecksum(e);
				// Fix endianness if run on big-endian machine
				if (isBigEndian()) e = StAmsdosEndian(e);

				// Insert the header before the file
				memmove(&Buff[sizeof(StAmsdos)], Buff, Lg);
				memcpy(Buff, e, sizeof(StAmsdos));
				Lg += sizeof(StAmsdos);
			}
			else
				cout << "File already has an header\n";
		break;
		case MODE_RAW :
			cout << "Using raw mode, no header\n";

	}

	// Copy the file inside the DSK image.
	if (CopieFichier(Buff, cFileName, Lg, 256, UserNumber, System_file, Read_only) != ERR_NO_ERR)
		ret = false;
	else
		ret = true;

	return ret;
}